

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

void __thiscall
unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::dump
          (basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *this,ostream *os,bool param_2)

{
  __extent_storage<18446744073709551615UL> in_RCX;
  span<const_std::byte,_18446744073709551615UL> key;
  key_view kVar1;
  value_view vVar2;
  ostream *local_40;
  __extent_storage<18446744073709551615UL> local_38;
  ostream *local_30;
  __extent_storage<18446744073709551615UL> local_28;
  bool param_2_local;
  ostream *os_local;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *this_local;
  
  std::operator<<(os,", ");
  kVar1 = get_key_view(this);
  local_30 = (ostream *)kVar1._M_ptr;
  local_28 = kVar1._M_extent._M_extent_value;
  key._M_extent._M_extent_value = in_RCX._M_extent_value;
  key._M_ptr = (pointer)local_28._M_extent_value;
  dump_key<std::span<std::byte_const,18446744073709551615ul>>((detail *)os,local_30,key);
  std::operator<<(os,", ");
  vVar2 = get_value_view(this);
  local_40 = (ostream *)vVar2._M_ptr;
  local_38 = vVar2._M_extent._M_extent_value;
  vVar2._M_extent._M_extent_value = in_RCX._M_extent_value;
  vVar2._M_ptr = (pointer)local_38._M_extent_value;
  dump_val((detail *)os,local_40,vVar2);
  std::operator<<(os,'\n');
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream &os,
                                                bool /*recursive*/) const {
    os << ", ";
    ::unodb::detail::dump_key(os, get_key_view());
    os << ", ";
    ::unodb::detail::dump_val(os, get_value_view());
    os << '\n';
  }